

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_main.c
# Opt level: O1

void wcsdump(char *e,wchar_t *w)

{
  wchar_t wVar1;
  wchar_t *pwVar2;
  char *fmt;
  char *fmt_00;
  
  logprintf("      %s = ",e);
  if (w == (wchar_t *)0x0) {
    fmt_00 = "(null)";
  }
  else {
    logprintf("\"");
    wVar1 = *w;
    fmt_00 = "\"\n";
    if (wVar1 != L'\0') {
      pwVar2 = w + 1;
      do {
        fmt = "%c";
        if (((0x5e < (uint)(wVar1 + L'\xffffffe0')) && (fmt = "\\x%02X", 0xff < (uint)wVar1)) &&
           (fmt = "\\U%08X", (uint)wVar1 < 0x10000)) {
          fmt = "\\u%04X";
        }
        logprintf(fmt);
        wVar1 = *pwVar2;
        pwVar2 = pwVar2 + 1;
      } while (wVar1 != L'\0');
    }
  }
  logprintf(fmt_00);
  return;
}

Assistant:

static void
wcsdump(const char *e, const wchar_t *w)
{
	logprintf("      %s = ", e);
	if (w == NULL) {
		logprintf("(null)");
		return;
	}
	logprintf("\"");
	while (*w != L'\0') {
		unsigned int c = *w++;
		if (c >= 32 && c < 127)
			logprintf("%c", (int)c);
		else if (c < 256)
			logprintf("\\x%02X", c);
		else if (c < 0x10000)
			logprintf("\\u%04X", c);
		else
			logprintf("\\U%08X", c);
	}
	logprintf("\"\n");
}